

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bson_error.hpp
# Opt level: O2

string * __thiscall
jsoncons::bson::bson_error_category_impl::message_abi_cxx11_
          (string *__return_storage_ptr__,bson_error_category_impl *this,int ev)

{
  allocator<char> *__a;
  char *__s;
  allocator<char> local_17;
  allocator<char> local_16;
  allocator<char> local_15;
  allocator<char> local_14;
  allocator<char> local_13;
  allocator<char> local_12;
  allocator<char> local_11;
  allocator<char> local_10;
  allocator<char> local_f;
  allocator<char> local_e;
  allocator<char> local_d;
  allocator<char> local_c;
  allocator<char> local_b;
  allocator<char> local_a;
  allocator<char> local_9;
  
  switch(ev) {
  case 1:
    __s = "Unexpected end of file";
    __a = &local_9;
    break;
  case 2:
    __s = "Source error";
    __a = &local_a;
    break;
  case 3:
    __s = "Illegal UTF-8 encoding in text string";
    __a = &local_b;
    break;
  case 4:
    __s = "Data item nesting exceeds limit in options";
    __a = &local_c;
    break;
  case 5:
    __s = "Request for the length of a string returned a non-positive result";
    __a = &local_d;
    break;
  case 6:
    __s = "Request for the length of a binary returned a negative result";
    __a = &local_e;
    break;
  case 7:
    __s = "Number too large";
    __a = &local_10;
    break;
  case 8:
    __s = "Invalid decimal128 string";
    __a = &local_11;
    break;
  case 9:
    __s = "datetime too small";
    __a = &local_13;
    break;
  case 10:
    __s = "datetime too large";
    __a = &local_12;
    break;
  case 0xb:
    __s = "Expected BSON document";
    __a = &local_14;
    break;
  case 0xc:
    __s = "Invalid regex string";
    __a = &local_15;
    break;
  case 0xd:
    __s = "Document or array size doesn\'t match bytes read";
    __a = &local_16;
    break;
  case 0xe:
    __s = "An unknown type was found in the stream";
    __a = &local_f;
    break;
  default:
    __s = "Unknown BSON parser error";
    __a = &local_17;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,__s,__a);
  return __return_storage_ptr__;
}

Assistant:

std::string message(int ev) const override
    {
        switch (static_cast<bson_errc>(ev))
        {
            case bson_errc::unexpected_eof:
                return "Unexpected end of file";
            case bson_errc::source_error:
                return "Source error";
            case bson_errc::invalid_utf8_text_string:
                return "Illegal UTF-8 encoding in text string";
            case bson_errc::max_nesting_depth_exceeded:
                return "Data item nesting exceeds limit in options";
            case bson_errc::string_length_is_non_positive:
                return "Request for the length of a string returned a non-positive result";
            case bson_errc::length_is_negative:
                return "Request for the length of a binary returned a negative result";
            case bson_errc::unknown_type:
                return "An unknown type was found in the stream";
            case bson_errc::number_too_large:
                return "Number too large";
            case bson_errc::invalid_decimal128_string:
                return "Invalid decimal128 string";
            case bson_errc::datetime_too_large:
                return "datetime too large";
            case bson_errc::datetime_too_small:
                return "datetime too small";
            case bson_errc::expected_bson_document:
                return "Expected BSON document";
            case bson_errc::invalid_regex_string:
                return "Invalid regex string";
            case bson_errc::size_mismatch:
                return "Document or array size doesn't match bytes read";
            default:
                return "Unknown BSON parser error";
        }
    }